

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler.cpp
# Opt level: O0

long __thiscall
cubeb_resampler_speex<short,_delay_line<short>,_cubeb_resampler_speex_one_way<short>_>::
fill_internal_duplex
          (cubeb_resampler_speex<short,_delay_line<short>,_cubeb_resampler_speex_one_way<short>_>
           *this,short *in_buffer,long *input_frames_count,short *out_buffer,
          long output_frames_needed)

{
  uint32_t uVar1;
  short *output_buffer;
  short *psVar2;
  size_t *in_RDX;
  long in_RSI;
  long in_RDI;
  delay_line<short> *in_R8;
  size_t frames_resampled;
  long got;
  long output_frames_before_processing;
  short *out_unprocessed;
  short *resampled_input;
  short *in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  cubeb_resampler_speex_one_way<short> *this_00;
  short *in_stack_ffffffffffffffb8;
  cubeb_resampler_speex_one_way<short> *pcVar3;
  cubeb_resampler_speex_one_way<short> *in_stack_ffffffffffffffc0;
  uint32_t frames_needed;
  cubeb_resampler_speex_one_way<short> *local_8;
  
  if ((*(byte *)(in_RDI + 0x40) & 1) == 0) {
    frames_needed = 0;
    pcVar3 = (cubeb_resampler_speex_one_way<short> *)0x0;
    this_00 = (cubeb_resampler_speex_one_way<short> *)0x0;
    std::
    unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                  *)0x1188c9);
    uVar1 = cubeb_resampler_speex_one_way<short>::input_needed_for_output
                      (pcVar3,(int32_t)((ulong)this_00 >> 0x20));
    output_buffer = (short *)(ulong)uVar1;
    std::
    unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                  *)0x1188ed);
    pcVar3 = (cubeb_resampler_speex_one_way<short> *)
             cubeb_resampler_speex_one_way<short>::input_buffer
                       (this_00,(size_t)in_stack_ffffffffffffffa8);
    if (in_RSI == 0) {
      psVar2 = (short *)0x0;
    }
    else {
      std::unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_>::operator->
                ((unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> *)0x118915
                );
      delay_line<short>::input
                ((delay_line<short> *)this_00,in_stack_ffffffffffffffa8,
                 (uint32_t)((ulong)in_RDI >> 0x20));
      in_stack_ffffffffffffffa8 = (short *)0x0;
      std::unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_>::operator->
                ((unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> *)0x118943
                );
      psVar2 = delay_line<short>::output(in_R8,frames_needed,(size_t *)pcVar3);
      *in_RDX = (size_t)in_stack_ffffffffffffffa8;
    }
    local_8 = (cubeb_resampler_speex_one_way<short> *)
              (**(code **)(in_RDI + 0x30))
                        (*(undefined8 *)(in_RDI + 0x28),*(undefined8 *)(in_RDI + 0x38),psVar2,pcVar3
                         ,output_buffer);
    if (((long)output_buffer <= (long)local_8) ||
       (*(undefined1 *)(in_RDI + 0x40) = 1, -1 < (long)local_8)) {
      std::
      unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
      ::operator->((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                    *)0x1189d4);
      cubeb_resampler_speex_one_way<short>::written(local_8,(size_t)in_stack_ffffffffffffffa8);
      std::unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_>::operator->
                ((unique_ptr<delay_line<short>,_std::default_delete<delay_line<short>_>_> *)0x1189ef
                );
      delay_line<short>::drop_audio_if_needed((delay_line<short> *)local_8);
      std::
      unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
      ::operator->((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                    *)0x118a05);
      local_8 = (cubeb_resampler_speex_one_way<short> *)
                cubeb_resampler_speex_one_way<short>::output(pcVar3,output_buffer,(size_t)local_8);
      std::
      unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
      ::operator->((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                    *)0x118a2a);
      cubeb_resampler_speex_one_way<short>::drop_audio_if_needed(local_8);
    }
  }
  else {
    std::
    unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
    ::operator->((unique_ptr<cubeb_resampler_speex_one_way<short>,_std::default_delete<cubeb_resampler_speex_one_way<short>_>_>
                  *)0x11887b);
    local_8 = (cubeb_resampler_speex_one_way<short> *)
              cubeb_resampler_speex_one_way<short>::output
                        (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                         in_stack_ffffffffffffffb0);
  }
  return (long)local_8;
}

Assistant:

long
cubeb_resampler_speex<T, InputProcessor, OutputProcessor>::fill_internal_duplex(
    T * in_buffer, long * input_frames_count, T * out_buffer,
    long output_frames_needed)
{
  if (draining) {
    // discard input and drain any signal remaining in the resampler.
    return output_processor->output(out_buffer, output_frames_needed);
  }

  /* The input data, after eventual resampling. This is passed to the callback.
   */
  T * resampled_input = nullptr;
  /* The output buffer passed down in the callback, that might be resampled. */
  T * out_unprocessed = nullptr;
  long output_frames_before_processing = 0;
  /* The number of frames returned from the callback. */
  long got = 0;

  /* We need to determine how much frames to present to the consumer.
   * - If we have a two way stream, but we're only resampling input, we resample
   * the input to the number of output frames.
   * - If we have a two way stream, but we're only resampling the output, we
   * resize the input buffer of the output resampler to the number of input
   * frames, and we resample it afterwards.
   * - If we resample both ways, we resample the input to the number of frames
   * we would need to pass down to the consumer (before resampling the output),
   * get the output data, and resample it to the number of frames needed by the
   * caller. */

  output_frames_before_processing =
      output_processor->input_needed_for_output(output_frames_needed);
  /* fill directly the input buffer of the output processor to save a copy */
  out_unprocessed =
      output_processor->input_buffer(output_frames_before_processing);

  if (in_buffer) {
    /* process the input, and present exactly `output_frames_needed` in the
     * callback. */
    input_processor->input(in_buffer, *input_frames_count);

    size_t frames_resampled = 0;
    resampled_input = input_processor->output(output_frames_before_processing,
                                              &frames_resampled);
    *input_frames_count = frames_resampled;
  } else {
    resampled_input = nullptr;
  }

  got = data_callback(stream, user_ptr, resampled_input, out_unprocessed,
                      output_frames_before_processing);

  if (got < output_frames_before_processing) {
    draining = true;

    if (got < 0) {
      return got;
    }
  }

  output_processor->written(got);

  input_processor->drop_audio_if_needed();

  /* Process the output. If not enough frames have been returned from the
   * callback, drain the processors. */
  got = output_processor->output(out_buffer, output_frames_needed);

  output_processor->drop_audio_if_needed();

  return got;
}